

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::pushChoice
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Index choice)

{
  iterator __first;
  iterator __last;
  Index local_14;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *pTStack_10;
  Index choice_local;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *this_local;
  
  local_14 = choice;
  pTStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->choiceHeap,&local_14);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->choiceHeap);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->choiceHeap);
  std::
  push_heap<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::pushChoice(unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,(anon_class_8_1_8991fb9c_for__M_comp)this);
  return;
}

Assistant:

void pushChoice(Index choice) {
    choiceHeap.push_back(choice);
    std::push_heap(choiceHeap.begin(), choiceHeap.end(), [&](Index a, Index b) {
      return cmp(b, a);
    });
  }